

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

void Abc_NtkTransferPhases(Abc_Ntk_t *pNtkNew,Abc_Ntk_t *pNtk)

{
  int i;
  int Entry;
  Vec_Int_t *pVVar1;
  Abc_Obj_t *pAVar2;
  int iVar3;
  
  if (pNtk->vPhases == (Vec_Int_t *)0x0) {
    __assert_fail("pNtk->vPhases != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0xb6f,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  if (pNtk->vPhases->nSize == pNtk->vObjs->nSize) {
    if (pNtkNew->vPhases == (Vec_Int_t *)0x0) {
      iVar3 = pNtkNew->vObjs->nSize;
      pVVar1 = Vec_IntAlloc(iVar3);
      pVVar1->nSize = iVar3;
      if (pVVar1->pArray != (int *)0x0) {
        memset(pVVar1->pArray,0,(long)iVar3 << 2);
      }
      pNtkNew->vPhases = pVVar1;
      for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
        pAVar2 = Abc_NtkObj(pNtk,iVar3);
        if (((pAVar2 != (Abc_Obj_t *)0x0) &&
            (pAVar2 = (pAVar2->field_6).pCopy, pAVar2 != (Abc_Obj_t *)0x0)) &&
           ((pAVar2->field_0x14 & 0xf) != 0)) {
          pVVar1 = pNtkNew->vPhases;
          i = pAVar2->Id;
          Entry = Vec_IntEntry(pNtk->vPhases,iVar3);
          Vec_IntWriteEntry(pVVar1,i,Entry);
        }
      }
      return;
    }
    __assert_fail("pNtkNew->vPhases == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0xb71,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  __assert_fail("Vec_IntSize(pNtk->vPhases) == Abc_NtkObjNumMax(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0xb70,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkTransferPhases( Abc_Ntk_t * pNtkNew, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( pNtk->vPhases != NULL );
    assert( Vec_IntSize(pNtk->vPhases) == Abc_NtkObjNumMax(pNtk) );
    assert( pNtkNew->vPhases == NULL );
    pNtkNew->vPhases = Vec_IntStart( Abc_NtkObjNumMax(pNtkNew) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy && !Abc_ObjIsNone( (Abc_Obj_t *)pObj->pCopy ) )
            Vec_IntWriteEntry( pNtkNew->vPhases, Abc_ObjId( (Abc_Obj_t *)pObj->pCopy ), Vec_IntEntry(pNtk->vPhases, i) );
}